

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# esextcTextureBufferAtomicFunctions.cpp
# Opt level: O1

string * __thiscall
glcts::TextureBufferAtomicFunctions::getComputeShaderCode_abi_cxx11_
          (string *__return_storage_ptr__,TextureBufferAtomicFunctions *this,GLint work_group_size)

{
  ostream *poVar1;
  stringstream strstream;
  stringstream local_1a0 [16];
  undefined1 local_190 [376];
  
  std::__cxx11::stringstream::stringstream(local_1a0);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)local_190,
             "${VERSION}\n\n${TEXTURE_BUFFER_REQUIRE}\n${SHADER_IMAGE_ATOMIC_REQUIRE}\n\nprecision highp float;\n\nlayout (local_size_x = "
             ,0x75);
  poVar1 = (ostream *)std::ostream::operator<<((ostream *)local_190,work_group_size);
  std::__ostream_insert<char,std::char_traits<char>>
            (poVar1,
             " ) in;\n\nlayout(r32ui, binding = 0) coherent uniform highp uimageBuffer uimage_buffer;\n\nvoid main(void)\n{\n   uint value = imageLoad( uimage_buffer, int(gl_LocalInvocationID.x) + 1 ).x;\n   imageAtomicAdd( uimage_buffer, 0 , value );\n\n   memoryBarrier();\n   barrier();\n\n   value = imageLoad( uimage_buffer, 0 ).x;\n   imageAtomicCompSwap( uimage_buffer, int(gl_LocalInvocationID.x) + 1, gl_LocalInvocationID.x + 1u, value );\n}\n"
             ,0x1a7);
  std::__cxx11::stringbuf::str();
  std::__cxx11::stringstream::~stringstream(local_1a0);
  std::ios_base::~ios_base((ios_base *)(local_190 + 0x70));
  return __return_storage_ptr__;
}

Assistant:

std::string TextureBufferAtomicFunctions::getComputeShaderCode(glw::GLint work_group_size) const
{
	std::stringstream strstream;

	strstream << "${VERSION}\n"
				 "\n"
				 "${TEXTURE_BUFFER_REQUIRE}\n"
				 "${SHADER_IMAGE_ATOMIC_REQUIRE}\n"
				 "\n"
				 "precision highp float;\n"
				 "\n"
				 "layout (local_size_x = "
			  << work_group_size << " ) in;\n"
									"\n"
									"layout(r32ui, binding = 0) coherent uniform highp uimageBuffer uimage_buffer;\n"
									"\n"
									"void main(void)\n"
									"{\n"
									"   uint value = imageLoad( uimage_buffer, int(gl_LocalInvocationID.x) + 1 ).x;\n"
									"   imageAtomicAdd( uimage_buffer, 0 , value );\n"
									"\n"
									"   memoryBarrier();\n"
									"   barrier();\n"
									"\n"
									"   value = imageLoad( uimage_buffer, 0 ).x;\n"
									"   imageAtomicCompSwap( uimage_buffer, int(gl_LocalInvocationID.x) + 1, "
									"gl_LocalInvocationID.x + 1u, value );\n"
									"}\n";

	return strstream.str();
}